

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

PortExpressionSyntax * __thiscall slang::parsing::Parser::parsePortExpression(Parser *this)

{
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  undefined8 uVar4;
  PortReferenceSyntax *pPVar5;
  undefined4 extraout_var;
  PortConcatenationSyntax *pPVar6;
  Info *src;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  TokenKind kind;
  ulong uVar7;
  Token current;
  Token TVar8;
  Token TVar9;
  Token closeBrace;
  Token openBrace;
  Token local_210;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_200;
  undefined1 local_1f0;
  Token local_1e8;
  Token local_1d8;
  undefined1 local_1c8 [24];
  undefined1 auStack_1b0 [24];
  __extent_storage<18446744073709551615UL> local_198;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBrace);
  if (!bVar1) {
    pPVar5 = parsePortReference(this);
    return &pPVar5->super_PortExpressionSyntax;
  }
  Token::Token(&local_1e8);
  Token::Token(&local_210);
  local_1e8 = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  if ((local_1e8._0_4_ >> 0x10 & 1) != 0) {
    SVar3 = Token::location(&local_1e8);
    local_210 = ParserBase::missingToken(&this->super_ParserBase,CloseBrace,SVar3);
    auStack_1b0._8_8_ = (Info *)0x0;
    auStack_1b0._16_8_ = (pointer)0x0;
    goto LAB_00398354;
  }
  local_1c8._0_8_ = auStack_1b0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = (SyntaxNode *)0x10;
  current = ParserBase::peek(&this->super_ParserBase);
  local_1d8 = current;
  bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(current.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&local_1d8);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar3);
    }
LAB_003981df:
    local_210 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    src = local_210.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(current.kind);
    if (bVar1) {
      local_200._M_rest =
           (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parsePortReference(this);
      local_1f0 = 1;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                 (TokenOrSyntax *)&local_200._M_first);
      TVar8 = ParserBase::peek(&this->super_ParserBase);
      uVar4 = TVar8._0_8_;
      bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar8.kind);
      if (TVar8.kind != EndOfFile && !bVar1) {
        do {
          if ((short)uVar4 != 0x18) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) goto LAB_003981df;
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_200._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_1f0 = 0;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_200._M_first);
          TVar8 = ParserBase::peek(&this->super_ParserBase);
          kind = TVar8.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(kind);
          if (kind == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          if ((current.info == TVar8.info && current.kind == kind) &&
             (bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                                (&this->super_ParserBase,(DiagCode)0x10001,true), !bVar1)) break;
          pPVar5 = parsePortReference(this);
          local_200._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pPVar5;
          local_1f0 = 1;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_200._M_first);
          TVar9 = ParserBase::peek(&this->super_ParserBase);
          uVar4 = TVar9._0_8_;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar9.kind);
          uVar7 = TVar8._0_8_ & 0xffffffff;
          current.info = TVar8.info;
          current.kind = (short)uVar7;
          current._2_1_ = (char)(uVar7 >> 0x10);
          current.numFlags.raw = (char)(uVar7 >> 0x18);
          current.rawLen = (int)(uVar7 >> 0x20);
        } while (TVar9.kind != EndOfFile && !bVar1);
      }
      goto LAB_003981df;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,current,CloseBrace,&local_210,(DiagCode)0x10001);
    src = extraout_RDX;
  }
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  auStack_1b0._16_8_ = CONCAT44(extraout_var,iVar2);
  if ((pointer)local_1c8._0_8_ != (pointer)auStack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
  auStack_1b0._8_8_ = extraout_RDX_00;
LAB_00398354:
  local_1c8._8_4_ = 3;
  local_1c8._16_8_ = (SyntaxNode *)0x0;
  auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  local_1c8._0_8_ = &PTR_getChild_005cc1b0;
  local_198._M_extent_value = auStack_1b0._8_8_;
  pPVar6 = slang::syntax::SyntaxFactory::portConcatenation
                     (&this->factory,local_1e8,
                      (SeparatedSyntaxList<slang::syntax::PortReferenceSyntax> *)local_1c8,local_210
                     );
  return &pPVar6->super_PortExpressionSyntax;
}

Assistant:

PortExpressionSyntax& Parser::parsePortExpression() {
    if (peek(TokenKind::OpenBrace)) {
        Token openBrace, closeBrace;
        std::span<TokenOrSyntax> items;

        parseList<isIdentifierOrComma, isEndOfBracedList>(
            TokenKind::OpenBrace, TokenKind::CloseBrace, TokenKind::Comma, openBrace, items,
            closeBrace, RequireItems::True, diag::ExpectedExpression,
            [this] { return &parsePortReference(); });

        return factory.portConcatenation(openBrace, items, closeBrace);
    }
    return parsePortReference();
}